

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void __thiscall
icu_63::NFRule::doFormat
          (NFRule *this,int64_t number,UnicodeString *toInsertInto,int32_t pos,
          int32_t recursionCount,UErrorCode *status)

{
  PluralFormat *this_00;
  NFSubstitution *pNVar1;
  int iVar2;
  UnicodeString *pUVar3;
  UnicodeString *pUVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint64_t uVar7;
  int local_1bc;
  int local_19c;
  UnicodeString local_110;
  UnicodeString local_d0;
  UnicodeString local_80;
  int32_t local_40;
  int local_3c;
  int initialLength;
  int pluralRuleEnd;
  int32_t lengthOffset;
  int32_t pluralRuleStart;
  UErrorCode *status_local;
  int32_t recursionCount_local;
  int32_t pos_local;
  UnicodeString *toInsertInto_local;
  int64_t number_local;
  NFRule *this_local;
  
  _lengthOffset = status;
  status_local._0_4_ = recursionCount;
  status_local._4_4_ = pos;
  _recursionCount_local = toInsertInto;
  toInsertInto_local = (UnicodeString *)number;
  number_local = (int64_t)this;
  pluralRuleEnd = UnicodeString::length(&this->fRuleText);
  initialLength = 0;
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    UnicodeString::insert(_recursionCount_local,status_local._4_4_,&this->fRuleText);
  }
  else {
    pluralRuleEnd = UnicodeString::indexOf(&this->fRuleText,L"$(",-1,0);
    local_3c = UnicodeString::indexOf(&this->fRuleText,L")$",-1,pluralRuleEnd);
    local_40 = UnicodeString::length(_recursionCount_local);
    iVar2 = local_3c;
    iVar5 = UnicodeString::length(&this->fRuleText);
    pUVar3 = _recursionCount_local;
    iVar6 = status_local._4_4_;
    if (iVar2 < iVar5 + -1) {
      UnicodeString::tempSubString(&local_80,&this->fRuleText,local_3c + 2,0x7fffffff);
      UnicodeString::insert(pUVar3,iVar6,&local_80);
      UnicodeString::~UnicodeString(&local_80);
    }
    pUVar4 = toInsertInto_local;
    pUVar3 = _recursionCount_local;
    iVar6 = status_local._4_4_;
    this_00 = this->rulePatternFormat;
    uVar7 = util64_pow(this->radix,this->exponent);
    PluralFormat::format(&local_d0,this_00,(int32_t)((ulong)pUVar4 / uVar7),_lengthOffset);
    UnicodeString::insert(pUVar3,iVar6,&local_d0);
    UnicodeString::~UnicodeString(&local_d0);
    pUVar3 = _recursionCount_local;
    iVar6 = status_local._4_4_;
    if (0 < pluralRuleEnd) {
      UnicodeString::tempSubString(&local_110,&this->fRuleText,0,pluralRuleEnd);
      UnicodeString::insert(pUVar3,iVar6,&local_110);
      UnicodeString::~UnicodeString(&local_110);
    }
    iVar6 = UnicodeString::length(&this->fRuleText);
    iVar5 = UnicodeString::length(_recursionCount_local);
    initialLength = iVar6 - (iVar5 - local_40);
  }
  pUVar4 = toInsertInto_local;
  pUVar3 = _recursionCount_local;
  iVar2 = status_local._4_4_;
  if (this->sub2 != (NFSubstitution *)0x0) {
    pNVar1 = this->sub2;
    iVar6 = NFSubstitution::getPos(this->sub2);
    if (pluralRuleEnd < iVar6) {
      local_19c = initialLength;
    }
    else {
      local_19c = 0;
    }
    (*(pNVar1->super_UObject)._vptr_UObject[6])
              (pNVar1,pUVar4,pUVar3,(ulong)(uint)(iVar2 - local_19c),(ulong)(uint)status_local,
               _lengthOffset);
  }
  pUVar4 = toInsertInto_local;
  pUVar3 = _recursionCount_local;
  iVar2 = status_local._4_4_;
  if (this->sub1 != (NFSubstitution *)0x0) {
    pNVar1 = this->sub1;
    iVar6 = NFSubstitution::getPos(this->sub1);
    if (pluralRuleEnd < iVar6) {
      local_1bc = initialLength;
    }
    else {
      local_1bc = 0;
    }
    (*(pNVar1->super_UObject)._vptr_UObject[6])
              (pNVar1,pUVar4,pUVar3,(ulong)(uint)(iVar2 - local_1bc),(ulong)(uint)status_local,
               _lengthOffset);
  }
  return;
}

Assistant:

void
NFRule::doFormat(int64_t number, UnicodeString& toInsertInto, int32_t pos, int32_t recursionCount, UErrorCode& status) const
{
    // first, insert the rule's rule text into toInsertInto at the
    // specified position, then insert the results of the substitutions
    // into the right places in toInsertInto (notice we do the
    // substitutions in reverse order so that the offsets don't get
    // messed up)
    int32_t pluralRuleStart = fRuleText.length();
    int32_t lengthOffset = 0;
    if (!rulePatternFormat) {
        toInsertInto.insert(pos, fRuleText);
    }
    else {
        pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
        int pluralRuleEnd = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart);
        int initialLength = toInsertInto.length();
        if (pluralRuleEnd < fRuleText.length() - 1) {
            toInsertInto.insert(pos, fRuleText.tempSubString(pluralRuleEnd + 2));
        }
        toInsertInto.insert(pos,
            rulePatternFormat->format((int32_t)(number/util64_pow(radix, exponent)), status));
        if (pluralRuleStart > 0) {
            toInsertInto.insert(pos, fRuleText.tempSubString(0, pluralRuleStart));
        }
        lengthOffset = fRuleText.length() - (toInsertInto.length() - initialLength);
    }

    if (sub2 != NULL) {
        sub2->doSubstitution(number, toInsertInto, pos - (sub2->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
    if (sub1 != NULL) {
        sub1->doSubstitution(number, toInsertInto, pos - (sub1->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
}